

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall gl4cts::GPUShaderFP64Test5::deinit(GPUShaderFP64Test5 *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  GPUShaderFP64Test5 *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->m_base_value_bo_data != (uchar *)0x0) {
    if (this->m_base_value_bo_data != (uchar *)0x0) {
      operator_delete__(this->m_base_value_bo_data);
    }
    this->m_base_value_bo_data = (uchar *)0x0;
  }
  if (this->m_base_value_bo_id != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_base_value_bo_id);
    this->m_base_value_bo_id = 0;
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar3 + 0x490))(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  if (this->m_xfb_bo_id != 0) {
    (**(code **)(lVar3 + 0x438))(1,&this->m_xfb_bo_id);
    this->m_xfb_bo_id = 0;
  }
  deinitInteration(this);
  return;
}

Assistant:

void GPUShaderFP64Test5::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_base_value_bo_data != DE_NULL)
	{
		delete[] m_base_value_bo_data;

		m_base_value_bo_data = DE_NULL;
	}

	if (m_base_value_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_base_value_bo_id);

		m_base_value_bo_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}

	if (m_xfb_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_xfb_bo_id);

		m_xfb_bo_id = 0;
	}

	/* TCU_FAIL will skip the per sub test iteration de-initialization, we need to
	 * take care of it here
	 */
	deinitInteration();
}